

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::WriteInit(CWriter *this)

{
  bool bVar1;
  const_reference ppMVar2;
  vector<wabt::Var_*,_std::allocator<wabt::Var_*>_> *this_00;
  reference ppVVar3;
  Func *pFVar4;
  mapped_type *name;
  char *pcVar5;
  undefined1 auVar6 [16];
  string_view module_name;
  Newline local_13b;
  CloseBrace local_13a [2];
  string_view local_138;
  GlobalName local_128;
  ExternalRef local_118;
  Var *local_108;
  Var *var;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<wabt::Var_*,_std::allocator<wabt::Var_*>_> *__range2_1;
  GlobalName local_e0;
  reference local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *import_module_name_1;
  iterator __end3;
  iterator __begin3;
  SymbolSet *__range3;
  Newline local_9a;
  OpenBrace local_99;
  GlobalName local_98;
  undefined1 local_88 [16];
  string local_78;
  reference local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *import_module_name;
  iterator __end2;
  iterator __begin2;
  SymbolSet *__range2;
  Newline local_11;
  CWriter *local_10;
  CWriter *this_local;
  
  local_10 = this;
  (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
            ((string *)&__range2,(CWriter *)this);
  pcVar5 = "wasm2c_";
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::Newline,char_const(&)[6],char_const(&)[8],std::__cxx11::string&,char_const(&)[14],std::__cxx11::string,char_const(&)[11]>
            ((CWriter *)this,&local_11,(char (*) [6])"void ",(char (*) [8])"wasm2c_",
             &this->module_prefix_,(char (*) [14])"_instantiate(",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,
             (char (*) [11])"* instance");
  std::__cxx11::string::~string((string *)&__range2);
  __end2 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->import_module_set_);
  import_module_name =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->import_module_set_);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&import_module_name);
    if (!bVar1) break;
    local_58 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2);
    auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_58);
    module_name._M_len = auVar6._8_8_;
    module_name._M_str = pcVar5;
    local_88 = auVar6;
    (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
              (&local_78,auVar6._0_8_,module_name);
    GlobalName::GlobalName(&local_98,Import,local_58);
    pcVar5 = "* ";
    (anonymous_namespace)::CWriter::
    Write<char_const(&)[10],std::__cxx11::string,char_const(&)[3],wabt::(anonymous_namespace)::GlobalName>
              ((CWriter *)this,(char (*) [10])", struct ",&local_78,(char (*) [3])0x37c056,&local_98
              );
    std::__cxx11::string::~string((string *)&local_78);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::OpenBrace>
            ((CWriter *)this,(char (*) [3])0x37f708,&local_99);
  (anonymous_namespace)::CWriter::Write<char_const(&)[34],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [34])"assert(wasm_rt_is_initialized());",&local_9a);
  bVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->import_module_set_);
  if (!bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&__range3,
               "init_instance_import(instance");
    Write(this,___range3);
    __end3 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->import_module_set_);
    import_module_name_1 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->import_module_set_);
    while( true ) {
      bVar1 = std::operator!=(&__end3,(_Self *)&import_module_name_1);
      if (!bVar1) break;
      local_d0 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end3);
      GlobalName::GlobalName(&local_e0,Import,local_d0);
      (anonymous_namespace)::CWriter::
      Write<char_const(&)[3],wabt::(anonymous_namespace)::GlobalName>
                ((CWriter *)this,(char (*) [3])0x37f5cf,&local_e0);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end3);
    }
    (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [3])0x37d78e,(Newline *)((long)&__range2_1 + 7));
  }
  bVar1 = std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>::empty
                    (&this->module_->globals);
  if (!bVar1) {
    (anonymous_namespace)::CWriter::Write<char_const(&)[24],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [24])"init_globals(instance);",
               (Newline *)((long)&__range2_1 + 6));
  }
  bVar1 = std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::empty(&this->module_->tables);
  if (!bVar1) {
    (anonymous_namespace)::CWriter::Write<char_const(&)[23],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [23])"init_tables(instance);",
               (Newline *)((long)&__range2_1 + 5));
  }
  bVar1 = std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::empty
                    (&this->module_->memories);
  if (!bVar1) {
    (anonymous_namespace)::CWriter::Write<char_const(&)[25],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [25])"init_memories(instance);",
               (Newline *)((long)&__range2_1 + 4));
    bVar1 = IsSingleUnsharedMemory(this);
    if (bVar1) {
      ppMVar2 = std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::operator[]
                          (&this->module_->memories,0);
      InstallSegueBase(this,*ppMVar2,true);
    }
  }
  bVar1 = std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::empty(&this->module_->tables);
  if (!bVar1) {
    bVar1 = std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>::empty
                      (&this->module_->elem_segments);
    if (!bVar1) {
      (anonymous_namespace)::CWriter::Write<char_const(&)[31],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(char (*) [31])"init_elem_instances(instance);",
                 (Newline *)((long)&__range2_1 + 3));
    }
  }
  bVar1 = std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::empty
                    (&this->module_->memories);
  if (!bVar1) {
    bVar1 = std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>::empty
                      (&this->module_->data_segments);
    if (!bVar1) {
      (anonymous_namespace)::CWriter::Write<char_const(&)[31],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(char (*) [31])"init_data_instances(instance);",
                 (Newline *)((long)&__range2_1 + 2));
    }
  }
  this_00 = &this->module_->starts;
  __end2_1 = std::vector<wabt::Var_*,_std::allocator<wabt::Var_*>_>::begin(this_00);
  var = (Var *)std::vector<wabt::Var_*,_std::allocator<wabt::Var_*>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<wabt::Var_*const_*,_std::vector<wabt::Var_*,_std::allocator<wabt::Var_*>_>_>
                        *)&var);
    if (!bVar1) break;
    ppVVar3 = __gnu_cxx::
              __normal_iterator<wabt::Var_*const_*,_std::vector<wabt::Var_*,_std::allocator<wabt::Var_*>_>_>
              ::operator*(&__end2_1);
    local_108 = *ppVVar3;
    pFVar4 = Module::GetFunc(this->module_,local_108);
    ExternalRef::GlobalName(&local_118,Func,&pFVar4->name);
    Write(this,&local_118);
    pFVar4 = Module::GetFunc(this->module_,local_108);
    bVar1 = IsImport(this,&pFVar4->name);
    if (bVar1) {
      pFVar4 = Module::GetFunc(this->module_,local_108);
      name = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->import_module_sym_map_,&pFVar4->name);
      GlobalName::GlobalName(&local_128,Import,name);
      (anonymous_namespace)::CWriter::
      Write<char_const(&)[12],wabt::(anonymous_namespace)::GlobalName,char_const(&)[3]>
                ((CWriter *)this,(char (*) [12])"(instance->",&local_128,(char (*) [3])0x37d78e);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_138,"(instance);");
      Write(this,local_138);
    }
    Write(this);
    __gnu_cxx::
    __normal_iterator<wabt::Var_*const_*,_std::vector<wabt::Var_*,_std::allocator<wabt::Var_*>_>_>::
    operator++(&__end2_1);
  }
  bVar1 = IsSingleUnsharedMemory(this);
  if (bVar1) {
    RestoreSegueBase(this);
  }
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,local_13a,&local_13b);
  return;
}

Assistant:

void CWriter::WriteInit() {
  Write(Newline(), "void ", kAdminSymbolPrefix, module_prefix_, "_instantiate(",
        ModuleInstanceTypeName(), "* instance");
  for (const auto& import_module_name : import_module_set_) {
    Write(", struct ", ModuleInstanceTypeName(import_module_name), "* ",
          GlobalName(ModuleFieldType::Import, import_module_name));
  }
  Write(") ", OpenBrace());

  Write("assert(wasm_rt_is_initialized());", Newline());

  if (!import_module_set_.empty()) {
    Write("init_instance_import(instance");
    for (const auto& import_module_name : import_module_set_) {
      Write(", ", GlobalName(ModuleFieldType::Import, import_module_name));
    }
    Write(");", Newline());
  }

  if (!module_->globals.empty()) {
    Write("init_globals(instance);", Newline());
  }
  if (!module_->tables.empty()) {
    Write("init_tables(instance);", Newline());
  }
  if (!module_->memories.empty()) {
    Write("init_memories(instance);", Newline());
    if (IsSingleUnsharedMemory()) {
      InstallSegueBase(module_->memories[0], true /* save_old_value */);
    }
  }
  if (!module_->tables.empty() && !module_->elem_segments.empty()) {
    Write("init_elem_instances(instance);", Newline());
  }
  if (!module_->memories.empty() && !module_->data_segments.empty()) {
    Write("init_data_instances(instance);", Newline());
  }

  for (Var* var : module_->starts) {
    Write(ExternalRef(ModuleFieldType::Func, module_->GetFunc(*var)->name));
    if (IsImport(module_->GetFunc(*var)->name)) {
      Write("(instance->",
            GlobalName(ModuleFieldType::Import,
                       import_module_sym_map_[module_->GetFunc(*var)->name]),
            ");");
    } else {
      Write("(instance);");
    }
    Write(Newline());
  }

  if (IsSingleUnsharedMemory()) {
    RestoreSegueBase();
  }
  Write(CloseBrace(), Newline());
}